

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Widget.cpp
# Opt level: O0

void __thiscall gui::Widget::Widget(Widget *this,String *name)

{
  Drawable *in_RDI;
  String *in_stack_ffffffffffffffa8;
  Transformable *this_00;
  
  std::enable_shared_from_this<gui::Widget>::enable_shared_from_this
            ((enable_shared_from_this<gui::Widget> *)0x22e7c1);
  sf::Drawable::Drawable(in_RDI);
  in_RDI->_vptr_Drawable = (_func_int **)&PTR__Widget_0047ecd8;
  Signal<gui::Widget_*>::Signal((Signal<gui::Widget_*> *)0x22e7e8);
  Signal<gui::Widget_*>::Signal((Signal<gui::Widget_*> *)0x22e7fd);
  Signal<gui::Widget_*>::Signal((Signal<gui::Widget_*> *)0x22e815);
  Signal<gui::Widget_*>::Signal((Signal<gui::Widget_*> *)0x22e82d);
  this_00 = (Transformable *)(in_RDI + 0x1f);
  sf::Transformable::Transformable(this_00);
  sf::String::String((String *)this_00,in_stack_ffffffffffffffa8);
  in_RDI[0x39]._vptr_Drawable = (_func_int **)0x0;
  in_RDI[0x3a]._vptr_Drawable = (_func_int **)0x0;
  *(undefined1 *)&in_RDI[0x3b]._vptr_Drawable = 1;
  *(undefined1 *)((long)&in_RDI[0x3b]._vptr_Drawable + 1) = 1;
  *(undefined1 *)((long)&in_RDI[0x3b]._vptr_Drawable + 2) = 0;
  *(undefined1 *)((long)&in_RDI[0x3b]._vptr_Drawable + 3) = 1;
  *(undefined1 *)((long)&in_RDI[0x3b]._vptr_Drawable + 4) = 0;
  return;
}

Assistant:

Widget::Widget(const sf::String& name) :
    name_(name),
    parent_(nullptr),
    gui_(nullptr),
    visible_(true),
    enabled_(true),
    focused_(false),
    focusable_(true),
    mouseHover_(false) {
}